

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

Vector3D * __thiscall
CS248::Application::getMouseProjection
          (Vector3D *__return_storage_ptr__,Application *this,double dist)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  Vector4D ray_wor4;
  Matrix4x4 modelview_matrix;
  GLdouble modelview [16];
  GLdouble projection [16];
  Matrix4x4 projection_matrix;
  Vector4D local_2f8;
  Vector4D local_2d8;
  Matrix4x4 local_2b8;
  Matrix4x4 local_238;
  double local_1b8 [16];
  double local_138 [17];
  Matrix4x4 local_b0;
  
  glGetDoublev(0xba7,local_138);
  Matrix4x4::Matrix4x4(&local_b0,local_138);
  glGetDoublev(0xba6,local_1b8);
  Matrix4x4::Matrix4x4(&local_238,local_1b8);
  uVar1 = this->screenH;
  local_2d8.x = (double)((this->mouseX + this->mouseX) / (float)this->screenW + -1.0);
  dVar4 = (double)((float)uVar1 - this->mouseY);
  auVar5._8_4_ = (int)(uVar1 >> 0x20);
  auVar5._0_8_ = uVar1;
  auVar5._12_4_ = 0x45300000;
  local_2d8.y = (dVar4 + dVar4) /
                ((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) + -1.0;
  local_2d8.z = -1.0;
  local_2d8.w = 1.0;
  Matrix4x4::inv(&local_2b8,&local_b0);
  Matrix4x4::operator*(&local_2b8,&local_2d8);
  local_2f8.z = -1.0;
  local_2f8.w = 0.0;
  Matrix4x4::operator*(&local_238,&local_2f8);
  dVar2 = (this->camera).pos.x;
  dVar3 = (this->camera).pos.y;
  dVar4 = (this->camera).pos.z;
  if ((ulong)ABS(dist) < 0x7ff0000000000000) {
    dVar6 = 1.0 / SQRT(local_2b8.entries[0].z * local_2b8.entries[0].z +
                       local_2b8.entries[0].x * local_2b8.entries[0].x +
                       local_2b8.entries[0].y * local_2b8.entries[0].y);
    local_2b8.entries[0].z = local_2b8.entries[0].z * dVar6;
    local_2b8.entries[0].x = local_2b8.entries[0].x * dVar6;
    local_2b8.entries[0].y = local_2b8.entries[0].y * dVar6;
  }
  else {
    dist = (-local_2b8.entries[0].x * dVar2 - dVar3 * local_2b8.entries[0].y) -
           dVar4 * local_2b8.entries[0].z;
  }
  __return_storage_ptr__->x = dVar2 + dist * local_2b8.entries[0].x;
  __return_storage_ptr__->y = dVar3 + dist * local_2b8.entries[0].y;
  __return_storage_ptr__->z = dVar4 + local_2b8.entries[0].z * dist;
  return __return_storage_ptr__;
}

Assistant:

Vector3D Application::getMouseProjection(double dist) {
  // get projection matrix from OpenGL stack.
  GLdouble projection[16];
  glGetDoublev(GL_PROJECTION_MATRIX, projection);
  Matrix4x4 projection_matrix(projection);

  // get view matrix from OpenGL stack.
  GLdouble modelview[16];
  glGetDoublev(GL_MODELVIEW_MATRIX, modelview);
  Matrix4x4 modelview_matrix(modelview);

  // ray in clip coordinates
  double x = mouseX * 2 / screenW - 1;
  double y = screenH - mouseY;  // y is upside down
  y = y * 2 / screenH - 1;
  Vector4D ray_clip(x, y, -1.0, 1.0);
  // ray in eye coordinates
  Vector4D ray_eye = projection_matrix.inv() * ray_clip;

  // ray is into the screen and not a point.
  ray_eye.z = -1.0;
  ray_eye.w = 0.0;

  // ray in world coordinates
  Vector4D ray_wor4 = modelview_matrix * ray_eye;
  Vector3D ray_wor(ray_wor4.x, ray_wor4.y, ray_wor4.z);

  Vector3D ray_orig(camera.position());

  double t = dot(ray_orig, -ray_wor);
  if(std::isfinite(dist)) {
    // If a distance was given, use that instead
    ray_wor = ray_wor.unit();
    t = dist;
  }

  Vector3D intersect = ray_orig + t * ray_wor;

  return intersect;
}